

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

int __thiscall EPoller::epoll(EPoller *this,int timeout,ChannelList *activeChannels)

{
  int __epfd;
  epoll_event *__events;
  size_type sVar1;
  LogStream *this_00;
  Logger local_1000;
  int local_24;
  ChannelList *pCStack_20;
  int numEvents;
  ChannelList *activeChannels_local;
  EPoller *pEStack_10;
  int timeout_local;
  EPoller *this_local;
  
  __epfd = this->epollfd_;
  pCStack_20 = activeChannels;
  activeChannels_local._4_4_ = timeout;
  pEStack_10 = this;
  __events = (epoll_event *)
             std::vector<epoll_event,_std::allocator<epoll_event>_>::data(&this->events_);
  sVar1 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->events_);
  local_24 = epoll_wait(__epfd,__events,(int)sVar1,activeChannels_local._4_4_);
  if (local_24 < 1) {
    if (local_24 < 0) {
      Logger::Logger(&local_1000,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                     ,0x1d);
      this_00 = Logger::stream(&local_1000);
      LogStream::operator<<(this_00,"Error: epoll_wait");
      Logger::~Logger(&local_1000);
    }
  }
  else {
    fillActiveChannels(this,local_24,pCStack_20);
  }
  return local_24;
}

Assistant:

int EPoller::epoll(int timeout, ChannelList* activeChannels) {

    int numEvents = epoll_wait(epollfd_, events_.data(), static_cast<int>(events_.size()), timeout);

    if (numEvents > 0) {
        // LOG << numEvents <<" events happended";

        fillActiveChannels(numEvents, activeChannels);
        
    } else if (numEvents < 0) {
        LOG << "Error: epoll_wait";
    }

    return numEvents;
}